

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O3

int Test_SUNMatSpace(SUNMatrix A,int myid)

{
  int iVar1;
  long leniw;
  long lenrw;
  undefined8 local_28;
  undefined8 local_20;
  
  iVar1 = SUNMatSpace(A,&local_20,&local_28);
  sync_device(A);
  if (iVar1 == 0) {
    if (print_all_ranks == 0 && myid == 0) {
LAB_00102a95:
      printf("    PASSED test -- SUNMatSpace lenrw=%li ",local_20);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",myid);
      goto LAB_00102a95;
    }
    if (print_all_ranks == 0 && myid == 0) {
LAB_00102ac8:
      printf("leniw=%li\n",local_28);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",myid);
      goto LAB_00102ac8;
    }
    iVar1 = 0;
    if (myid != 0) {
      return 0;
    }
    goto LAB_00102ae0;
  }
  if (print_all_ranks == 0 && myid == 0) {
LAB_00102a6a:
    puts(">>> FAILED test -- SUNMatSpace ");
  }
  else if (print_all_ranks != 0) {
    printf("process %06d: ",myid);
    goto LAB_00102a6a;
  }
  iVar1 = 1;
LAB_00102ae0:
  if (print_time != 0) {
    printf("    SUNMatSpace Time: %22.15e \n \n",0);
  }
  return iVar1;
}

Assistant:

int Test_SUNMatSpace(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  long int lenrw, leniw;

  start_time = get_time();
  failure    = SUNMatSpace(A, &lenrw, &leniw);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatSpace \n", myid);
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else
  {
    TEST_STATUS2("    PASSED test -- SUNMatSpace lenrw=%li ", lenrw, myid);
    TEST_STATUS2("leniw=%li\n", leniw, myid);
  }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}